

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

color_quad_u8 __thiscall
crnlib::etc1_block::unpack_color4(etc1_block *this,uint16 packed_color4,bool scaled,uint alpha)

{
  uint alpha_00;
  undefined4 local_24;
  undefined4 local_20;
  uint r;
  uint g;
  uint b;
  uint alpha_local;
  bool scaled_local;
  uint16 packed_color4_local;
  
  r = packed_color4 & 0xf;
  local_20 = (int)(uint)packed_color4 >> 4 & 0xf;
  local_24 = (int)(uint)packed_color4 >> 8 & 0xf;
  if (scaled) {
    r = r << 4 | r;
    local_20 = local_20 << 4 | local_20;
    local_24 = local_24 << 4 | local_24;
  }
  alpha_00 = math::minimum<unsigned_int>(alpha,0xff);
  color_quad<unsigned_char,_int>::color_quad
            ((color_quad<unsigned_char,_int> *)this,cNoClamp,local_24,local_20,r,alpha_00);
  return (color_quad_u8)SUB84(this,0);
}

Assistant:

color_quad_u8 etc1_block::unpack_color4(uint16 packed_color4, bool scaled, uint alpha)
    {
        uint b = packed_color4 & 15U;
        uint g = (packed_color4 >> 4U) & 15U;
        uint r = (packed_color4 >> 8U) & 15U;

        if (scaled)
        {
            b = (b << 4U) | b;
            g = (g << 4U) | g;
            r = (r << 4U) | r;
        }

        return color_quad_u8(cNoClamp, r, g, b, math::minimum(alpha, 255U));
    }